

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray
               (Var instance,bool expectingNativeFloatArray,bool expectingVarArray)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptNativeArray *this;
  ArrayCallSiteInfo *this_00;
  
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xdfd,"(instance)","instance");
    if (!bVar2) goto LAB_00aba82a;
    *puVar3 = 0;
  }
  if (expectingNativeFloatArray == expectingVarArray) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xdfe,"(expectingNativeFloatArray ^ expectingVarArray)",
                                "expectingNativeFloatArray ^ expectingVarArray");
    if (!bVar2) goto LAB_00aba82a;
    *puVar3 = 0;
  }
  bVar2 = VarIs<Js::JavascriptNativeArray>(instance);
  if (bVar2) {
    this = UnsafeVarTo<Js::JavascriptNativeArray>(instance);
  }
  else {
    this = (JavascriptNativeArray *)0x0;
  }
  if (this != (JavascriptNativeArray *)0x0) {
    this_00 = JavascriptNativeArray::GetArrayCallSiteInfo(this);
    if (this_00 != (ArrayCallSiteInfo *)0x0) {
      if (expectingNativeFloatArray) {
        ArrayCallSiteInfo::SetIsNotNativeIntArray(this_00);
        return;
      }
      if (!expectingVarArray) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xe16,"(expectingVarArray)","expectingVarArray");
        if (!bVar2) {
LAB_00aba82a:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      ArrayCallSiteInfo::SetIsNotNativeArray(this_00);
      return;
    }
  }
  return;
}

Assistant:

void JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray(Var instance, const bool expectingNativeFloatArray, const bool expectingVarArray)
    {
        Assert(instance);
        Assert(expectingNativeFloatArray ^ expectingVarArray);

        JavascriptNativeArray * nativeArr = JavascriptOperators::TryFromVar<JavascriptNativeArray>(instance);
        if (!nativeArr)
        {
            return;
        }

        ArrayCallSiteInfo *const arrayCallSiteInfo = nativeArr->GetArrayCallSiteInfo();
        if (!arrayCallSiteInfo)
        {
            return;
        }

        if (expectingNativeFloatArray)
        {
            // Profile data is expecting a native float array. Ensure that at the array's creation site, that a native int array
            // is not created, such that the profiled array type would be correct.
            arrayCallSiteInfo->SetIsNotNativeIntArray();
        }
        else
        {
            // Profile data is expecting a var array. Ensure that at the array's creation site, that a native array is not
            // created, such that the profiled array type would be correct.
            Assert(expectingVarArray);
            arrayCallSiteInfo->SetIsNotNativeArray();
        }
    }